

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void av1_rd_pick_palette_intra_sbuv
               (AV1_COMP *cpi,MACROBLOCK *x,int dc_mode_cost,uint8_t *best_palette_color_map,
               MB_MODE_INFO *best_mbmi,int64_t *best_rd,int *rate,int *rate_tokenonly,
               int64_t *distortion,uint8_t *skippable)

{
  uint8_t uVar1;
  int16_t iVar2;
  short sVar3;
  MB_MODE_INFO *pMVar4;
  SequenceHeader *pSVar5;
  byte *pbVar6;
  PALETTE_BUFFER *pPVar7;
  uint8_t *color_map;
  AV1_COMP *pAVar8;
  int64_t iVar9;
  uint16_t uVar10;
  long lVar11;
  int iVar12;
  ushort *puVar13;
  int k;
  MACROBLOCKD *pMVar14;
  MACROBLOCKD *pMVar15;
  int16_t *piVar16;
  uint16_t *puVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ushort uVar21;
  long lVar22;
  ulong uVar23;
  int16_t iVar24;
  byte *pbVar25;
  ulong uVar26;
  ushort *puVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  ushort uVar32;
  ulong uVar33;
  MACROBLOCK *pMVar34;
  ulong uVar35;
  int cols;
  int rows;
  uint local_453c;
  int plane_block_height;
  int plane_block_width;
  int colors_threshold_v;
  int colors_threshold_u;
  byte *local_4528;
  MACROBLOCKD *local_4520;
  MB_MODE_INFO *local_4518;
  int local_450c;
  int colors_v;
  int colors_u;
  MACROBLOCK *local_4500;
  long *local_44f8;
  uint8_t *local_44f0;
  byte *local_44e8;
  ulong local_44e0;
  uint16_t *local_44d8;
  AV1_COMP *local_44d0;
  long local_44c8;
  long local_44c0;
  long local_44b8;
  int16_t *local_44b0;
  SequenceHeader *local_44a8;
  int local_449c;
  int16_t centroids [16];
  uint16_t color_cache [16];
  RD_STATS tokenonly_rd_stats;
  
  pMVar4 = *(x->e_mbd).mi;
  pSVar5 = (cpi->common).seq_params;
  colors_threshold_u = 0;
  local_4520 = &x->e_mbd;
  colors_threshold_v = 0;
  iVar12 = x->plane[1].src.stride;
  pbVar6 = x->plane[1].src.buf;
  pbVar25 = x->plane[2].src.buf;
  local_44f0 = (x->e_mbd).plane[1].color_index_map;
  local_453c = (uint)pMVar4->bsize;
  local_450c = dc_mode_cost;
  local_44f8 = best_rd;
  local_44d0 = cpi;
  av1_get_block_dimensions
            (pMVar4->bsize,1,local_4520,&plane_block_width,&plane_block_height,&rows,&cols);
  pMVar4->uv_mode = '\0';
  local_4528 = pbVar6;
  local_4518 = pMVar4;
  local_44a8 = pSVar5;
  if (pSVar5->use_highbitdepth == '\0') {
    av1_count_colors(pbVar6,iVar12,rows,cols,&tokenonly_rd_stats.rate,&colors_u);
    av1_count_colors(pbVar25,iVar12,rows,cols,&tokenonly_rd_stats.rate,&colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }
  else {
    av1_count_colors_highbd
              (pbVar6,iVar12,rows,cols,pSVar5->bit_depth,&tokenonly_rd_stats.rate,(int *)color_cache
               ,&colors_threshold_u,&colors_u);
    av1_count_colors_highbd
              (pbVar25,iVar12,rows,cols,pSVar5->bit_depth,&tokenonly_rd_stats.rate,
               (int *)color_cache,&colors_threshold_v,&colors_v);
  }
  local_449c = av1_get_palette_cache(local_4520,1,color_cache);
  iVar18 = colors_threshold_v;
  if (colors_threshold_v < colors_threshold_u) {
    iVar18 = colors_threshold_u;
  }
  if (iVar18 - 2U < 0x3f) {
    puVar27 = (ushort *)((long)local_4528 * 2);
    puVar13 = (ushort *)((long)pbVar25 * 2);
    uVar1 = local_44a8->use_highbitdepth;
    if (uVar1 == '\0') {
      uVar20 = (ulong)*local_4528;
      pMVar14 = (MACROBLOCKD *)(ulong)*pbVar25;
    }
    else {
      uVar20 = (ulong)*puVar27;
      pMVar14 = (MACROBLOCKD *)(ulong)*puVar13;
    }
    pPVar7 = x->palette_buffer;
    local_44b0 = pPVar7->kmeans_data_buf;
    lVar11 = (long)cols;
    uVar23 = 0;
    if (0 < cols) {
      uVar23 = (ulong)(uint)cols;
    }
    uVar28 = (ulong)(uint)rows;
    if (rows < 1) {
      uVar28 = 0;
    }
    piVar16 = local_44b0;
    lVar19 = 0;
    pbVar6 = local_4528;
    local_4520 = pMVar14;
    local_44e8 = pbVar25;
    local_44e0 = uVar20;
    for (uVar33 = 0; pbVar25 = pbVar6, lVar31 = lVar19, uVar33 != uVar28; uVar33 = uVar33 + 1) {
      local_44c0 = uVar33 * lVar11;
      lVar19 = lVar31;
      for (uVar26 = 0; uVar23 != uVar26; uVar26 = uVar26 + 1) {
        if (uVar1 == '\0') {
          uVar21 = (ushort)pbVar25[uVar26];
          uVar32 = (ushort)local_44e8[uVar26];
          lVar22 = (local_44c0 + uVar26) * 2;
          piVar16[uVar26 * 2] = uVar21;
        }
        else {
          uVar21 = puVar27[uVar26];
          uVar32 = puVar13[uVar26];
          piVar16[uVar26 * 2] = uVar21;
          lVar22 = lVar19;
        }
        uVar29 = (uint)uVar32;
        uVar30 = (uint)uVar21;
        uVar35 = uVar20;
        if ((uint)uVar20 < uVar30) {
          uVar35 = (ulong)uVar30;
        }
        if (uVar30 < (uint)local_44e0) {
          local_44e0 = (ulong)uVar30;
          uVar35 = uVar20;
        }
        uVar20 = uVar35;
        pMVar15 = pMVar14;
        if ((uint)pMVar14 < uVar29) {
          pMVar15 = (MACROBLOCKD *)(ulong)uVar29;
        }
        pPVar7->kmeans_data_buf[lVar22 + 1] = uVar32;
        if (uVar29 < (uint)local_4520) {
          local_4520 = (MACROBLOCKD *)(ulong)uVar29;
          pMVar15 = pMVar14;
        }
        lVar19 = lVar19 + 2;
        pMVar14 = pMVar15;
      }
      piVar16 = piVar16 + lVar11 * 2;
      puVar13 = puVar13 + iVar12;
      puVar27 = puVar27 + iVar12;
      local_44e8 = local_44e8 + iVar12;
      lVar19 = lVar31 + lVar11 * 2;
      pbVar6 = pbVar25 + iVar12;
      local_4528 = pbVar25;
      local_44c8 = lVar31;
    }
    if (colors_v < colors_u) {
      colors_v = colors_u;
    }
    iVar12 = 8;
    if (colors_v < 8) {
      iVar12 = colors_v;
    }
    local_44c0 = CONCAT44(local_44c0._4_4_,(int)uVar20 - (int)local_44e0);
    local_44c8 = CONCAT44(local_44c8._4_4_,(int)pMVar14 - (int)local_4520);
    local_44b8 = (long)iVar12;
    local_44e8 = (byte *)CONCAT44(local_44e8._4_4_,(int)pMVar14 * 2 + (int)local_4520 * -2);
    local_4528 = (byte *)CONCAT44(local_4528._4_4_,(int)uVar20 * 2 + (int)local_44e0 * -2);
    local_44d8 = (local_4518->palette_mode_info).palette_colors + 8;
    local_4500 = x;
    for (lVar11 = 2; pSVar5 = local_44a8, pAVar8 = local_44d0, lVar11 <= local_44b8;
        lVar11 = lVar11 + 1) {
      iVar12 = (int)local_44c0;
      iVar18 = (int)local_44c8;
      for (lVar19 = 0; k = (int)lVar11, lVar11 != lVar19; lVar19 = lVar19 + 1) {
        centroids[lVar19 * 2] =
             (short)((long)((ulong)(uint)((int)((long)iVar12 / (long)k) >> 0x1f) << 0x20 |
                           (long)iVar12 / (long)k & 0xffffffffU) / 2) + (short)local_44e0;
        centroids[lVar19 * 2 + 1] =
             (short)((long)((ulong)(uint)((int)((long)iVar18 / (long)k) >> 0x1f) << 0x20 |
                           (long)iVar18 / (long)k & 0xffffffffU) / 2) + (short)local_4520;
        iVar18 = iVar18 + (int)local_44e8;
        iVar12 = iVar12 + (int)local_4528;
      }
      av1_k_means_dim2(local_44b0,centroids,local_44f0,cols * rows,k,0x32);
      optimize_palette_colors
                (color_cache,local_449c,k,2,centroids,((pAVar8->common).seq_params)->bit_depth);
      color_map = local_44f0;
      uVar20 = 2;
      for (uVar23 = 0; uVar23 < lVar11 * 2 - 2U; uVar23 = uVar23 + 2) {
        iVar2 = centroids[uVar23];
        uVar33 = uVar23 & 0xffffffff;
        iVar24 = iVar2;
        for (uVar28 = uVar20; uVar28 < (ulong)(lVar11 * 2); uVar28 = uVar28 + 2) {
          sVar3 = centroids[uVar28];
          if (sVar3 < iVar24) {
            uVar33 = uVar28 & 0xffffffff;
          }
          if (sVar3 <= iVar24) {
            iVar24 = sVar3;
          }
        }
        if (uVar23 != uVar33) {
          iVar24 = centroids[uVar23 + 1];
          lVar19 = (long)(int)uVar33;
          centroids[uVar23] = centroids[lVar19];
          centroids[uVar23 + 1] = centroids[lVar19 + 1];
          centroids[lVar19] = iVar2;
          centroids[lVar19 + 1] = iVar24;
        }
        uVar20 = uVar20 + 2;
      }
      piVar16 = centroids;
      (*av1_calc_indices_dim2)(local_44b0,piVar16,local_44f0,(int64_t *)0x0,cols * rows,k);
      extend_palette_color_map(color_map,cols,rows,plane_block_width,plane_block_height);
      (local_4518->palette_mode_info).palette_size[1] = (uint8_t)lVar11;
      uVar1 = pSVar5->use_highbitdepth;
      puVar17 = local_44d8;
      for (lVar19 = 1; pAVar8 = local_44d0, pMVar34 = local_4500, lVar19 != 3; lVar19 = lVar19 + 1)
      {
        for (lVar31 = 0; lVar11 != lVar31; lVar31 = lVar31 + 1) {
          uVar10 = piVar16[lVar31 * 2];
          if (uVar1 == '\0') {
            if ((short)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfe < (short)uVar10) {
              uVar10 = 0xff;
            }
          }
          else {
            uVar10 = clip_pixel_highbd((int)(short)uVar10,local_44a8->bit_depth);
          }
          puVar17[lVar31] = uVar10;
        }
        puVar17 = puVar17 + 8;
        piVar16 = piVar16 + 1;
      }
      if ((local_44d0->sf).intra_sf.early_term_chroma_palette_size_search == 0) {
        av1_txfm_uvrd(local_44d0,local_4500,&tokenonly_rd_stats,(BLOCK_SIZE)local_453c,*local_44f8);
        iVar12 = tokenonly_rd_stats.rate;
        pMVar34 = local_4500;
        if (tokenonly_rd_stats.rate != 0x7fffffff) {
          iVar18 = intra_mode_info_cost_uv
                             (local_44d0,local_4500,local_4518,(BLOCK_SIZE)local_453c,local_450c);
          iVar18 = iVar18 + iVar12;
          goto LAB_001c5550;
        }
      }
      else {
        iVar18 = intra_mode_info_cost_uv
                           (local_44d0,local_4500,local_4518,(BLOCK_SIZE)local_453c,local_450c);
        if (*local_44f8 <= (long)pMVar34->rdmult * (long)iVar18 + 0x100 >> 9) break;
        av1_txfm_uvrd(pAVar8,pMVar34,&tokenonly_rd_stats,(BLOCK_SIZE)local_453c,*local_44f8);
        if (tokenonly_rd_stats.rate != 0x7fffffff) {
          iVar18 = tokenonly_rd_stats.rate + iVar18;
          pMVar34 = local_4500;
LAB_001c5550:
          iVar9 = tokenonly_rd_stats.dist;
          lVar19 = tokenonly_rd_stats.dist * 0x80 +
                   ((long)pMVar34->rdmult * (long)iVar18 + 0x100 >> 9);
          if (lVar19 < *local_44f8) {
            *local_44f8 = lVar19;
            memcpy(best_mbmi,local_4518,0xb0);
            memcpy(best_palette_color_map,local_44f0,
                   (long)plane_block_height * (long)plane_block_width);
            *rate = iVar18;
            *distortion = iVar9;
            *rate_tokenonly = tokenonly_rd_stats.rate;
            *skippable = tokenonly_rd_stats.skip_txfm;
          }
        }
      }
    }
  }
  if ((best_mbmi->palette_mode_info).palette_size[1] != '\0') {
    memcpy(local_44f0,best_palette_color_map,(long)plane_block_height * (long)plane_block_width);
  }
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sbuv(const AV1_COMP *cpi, MACROBLOCK *x,
                                    int dc_mode_cost,
                                    uint8_t *best_palette_color_map,
                                    MB_MODE_INFO *const best_mbmi,
                                    int64_t *best_rd, int *rate,
                                    int *rate_tokenonly, int64_t *distortion,
                                    uint8_t *skippable) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           mbmi->bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  int this_rate;
  int64_t this_rd;
  int colors_u, colors_v;
  int colors_threshold_u = 0, colors_threshold_v = 0, colors_threshold = 0;
  const int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  uint8_t *const color_map = xd->plane[1].color_index_map;
  RD_STATS tokenonly_rd_stats;
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  mbmi->uv_mode = UV_DC_PRED;
  if (seq_params->use_highbitdepth) {
    int count_buf[1 << 12];      // Maximum (1 << 12) color levels.
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src_u, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_u, &colors_u);
    av1_count_colors_highbd(src_v, src_stride, rows, cols,
                            seq_params->bit_depth, count_buf, count_buf_8bit,
                            &colors_threshold_v, &colors_v);
  } else {
    int count_buf[1 << 8];
    av1_count_colors(src_u, src_stride, rows, cols, count_buf, &colors_u);
    av1_count_colors(src_v, src_stride, rows, cols, count_buf, &colors_v);
    colors_threshold_u = colors_u;
    colors_threshold_v = colors_v;
  }

  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);

  colors_threshold = colors_threshold_u > colors_threshold_v
                         ? colors_threshold_u
                         : colors_threshold_v;
  if (colors_threshold > 1 && colors_threshold <= 64) {
    int r, c, n, i, j;
    const int max_itr = 50;
    int lb_u, ub_u, val_u;
    int lb_v, ub_v, val_v;
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[2 * PALETTE_MAX_SIZE];

    uint16_t *src_u16 = CONVERT_TO_SHORTPTR(src_u);
    uint16_t *src_v16 = CONVERT_TO_SHORTPTR(src_v);
    if (seq_params->use_highbitdepth) {
      lb_u = src_u16[0];
      ub_u = src_u16[0];
      lb_v = src_v16[0];
      ub_v = src_v16[0];
    } else {
      lb_u = src_u[0];
      ub_u = src_u[0];
      lb_v = src_v[0];
      ub_v = src_v[0];
    }

    for (r = 0; r < rows; ++r) {
      for (c = 0; c < cols; ++c) {
        if (seq_params->use_highbitdepth) {
          val_u = src_u16[r * src_stride + c];
          val_v = src_v16[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        } else {
          val_u = src_u[r * src_stride + c];
          val_v = src_v[r * src_stride + c];
          data[(r * cols + c) * 2] = val_u;
          data[(r * cols + c) * 2 + 1] = val_v;
        }
        if (val_u < lb_u)
          lb_u = val_u;
        else if (val_u > ub_u)
          ub_u = val_u;
        if (val_v < lb_v)
          lb_v = val_v;
        else if (val_v > ub_v)
          ub_v = val_v;
      }
    }

    const int colors = colors_u > colors_v ? colors_u : colors_v;
    const int max_colors =
        colors > PALETTE_MAX_SIZE ? PALETTE_MAX_SIZE : colors;
    for (n = PALETTE_MIN_SIZE; n <= max_colors; ++n) {
      for (i = 0; i < n; ++i) {
        centroids[i * 2] = lb_u + (2 * i + 1) * (ub_u - lb_u) / n / 2;
        centroids[i * 2 + 1] = lb_v + (2 * i + 1) * (ub_v - lb_v) / n / 2;
      }
      av1_k_means(data, centroids, color_map, rows * cols, n, 2, max_itr);
      optimize_palette_colors(color_cache, n_cache, n, 2, centroids,
                              cpi->common.seq_params->bit_depth);
      // Sort the U channel colors in ascending order.
      for (i = 0; i < 2 * (n - 1); i += 2) {
        int min_idx = i;
        int min_val = centroids[i];
        for (j = i + 2; j < 2 * n; j += 2)
          if (centroids[j] < min_val) min_val = centroids[j], min_idx = j;
        if (min_idx != i) {
          int temp_u = centroids[i], temp_v = centroids[i + 1];
          centroids[i] = centroids[min_idx];
          centroids[i + 1] = centroids[min_idx + 1];
          centroids[min_idx] = temp_u, centroids[min_idx + 1] = temp_v;
        }
      }
      av1_calc_indices(data, centroids, color_map, rows * cols, n, 2);
      extend_palette_color_map(color_map, cols, rows, plane_block_width,
                               plane_block_height);
      pmi->palette_size[1] = n;
      for (i = 1; i < 3; ++i) {
        for (j = 0; j < n; ++j) {
          if (seq_params->use_highbitdepth)
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] = clip_pixel_highbd(
                (int)centroids[j * 2 + i - 1], seq_params->bit_depth);
          else
            pmi->palette_colors[i * PALETTE_MAX_SIZE + j] =
                clip_pixel((int)centroids[j * 2 + i - 1]);
        }
      }

      if (cpi->sf.intra_sf.early_term_chroma_palette_size_search) {
        const int palette_mode_rate =
            intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
        const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
        // Terminate further palette_size search, if header cost corresponding
        // to lower palette_size is more than the best_rd.
        if (header_rd >= *best_rd) break;
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
      } else {
        av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, *best_rd);
        if (tokenonly_rd_stats.rate == INT_MAX) continue;
        this_rate = tokenonly_rd_stats.rate +
                    intra_mode_info_cost_uv(cpi, x, mbmi, bsize, dc_mode_cost);
      }

      this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
      if (this_rd < *best_rd) {
        *best_rd = this_rd;
        *best_mbmi = *mbmi;
        memcpy(best_palette_color_map, color_map,
               plane_block_width * plane_block_height *
                   sizeof(best_palette_color_map[0]));
        *rate = this_rate;
        *distortion = tokenonly_rd_stats.dist;
        *rate_tokenonly = tokenonly_rd_stats.rate;
        *skippable = tokenonly_rd_stats.skip_txfm;
      }
    }
  }
  if (best_mbmi->palette_mode_info.palette_size[1] > 0) {
    memcpy(color_map, best_palette_color_map,
           plane_block_width * plane_block_height *
               sizeof(best_palette_color_map[0]));
  }
}